

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_868a0::data<Imath_3_2::half>::checkValues
          (data<Imath_3_2::half> *this,
          vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> *data,Box2i *dw,
          bool dontbothercheckingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long *plVar7;
  pointer pvVar8;
  undefined7 in_register_00000009;
  pointer phVar9;
  long lVar10;
  long lVar11;
  pointer pbVar12;
  long lVar13;
  long lVar14;
  float fVar15;
  
  iVar4 = (dw->min).y;
  iVar1 = (dw->max).x;
  iVar2 = (dw->min).x;
  iVar3 = (dw->max).y;
  lVar5 = (long)(((iVar3 - iVar4) + 1) * ((iVar1 - iVar2) + 1));
  if (iVar3 < iVar4) {
    lVar5 = 1;
  }
  pbVar12 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (iVar1 < iVar2) {
    lVar5 = 1;
  }
  lVar5 = ((long)(this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) + lVar5;
  if ((int)CONCAT71(in_register_00000009,dontbothercheckingdepth) == 0) {
    if (lVar5 != 0) {
      pvVar8 = (this->_results).
               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      phVar9 = (data->super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar13 = 0;
      lVar11 = 0;
      lVar14 = 0;
      lVar10 = _imath_half_to_float_table;
      do {
        fVar15 = ABS(*(float *)(lVar10 + (ulong)*(ushort *)
                                                 (*(long *)&pvVar8[lVar13].
                                                                                                                        
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar11 * 2) * 4
                               ) - *(float *)(lVar10 + (ulong)phVar9[lVar14]._h * 4));
        if (0.005 < fVar15) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," (channel ",10);
          pbVar12 = (this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar12[lVar11]._M_dataplus._M_p,
                              pbVar12[lVar11]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar6 = (ostream *)
                   ::operator<<((ostream *)&std::cout,
                                (half)(data->
                                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar14]._h);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," expected ",10);
          plVar7 = (long *)::operator<<(poVar6,(half)*(uint16_t *)
                                                      (*(long *)&(this->_results).
                                                                                                                                  
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar11 * 2));
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          pvVar8 = (this->_results).
                   super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          phVar9 = (data->super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          fVar15 = ABS(*(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (*(long *)&pvVar8[lVar13].
                                                                                                        
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar11 * 2) * 4
                                 ) -
                       *(float *)(_imath_half_to_float_table + (ulong)phVar9[lVar14]._h * 4));
          lVar10 = _imath_half_to_float_table;
        }
        if (0.005 < fVar15) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x17e,
                        "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                       );
        }
        lVar11 = lVar11 + 1;
        if (lVar11 == (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_channels).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) {
          lVar13 = lVar13 + 1;
          if (lVar13 == ((long)(this->_results).
                               super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                        -0x5555555555555555) {
            lVar13 = 0;
          }
          lVar11 = 0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar5 != lVar14);
    }
  }
  else if (lVar5 != 0) {
    lVar11 = 0;
    lVar10 = 0;
    lVar13 = 0;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar12 + lVar10));
      if ((iVar4 != 0) &&
         (iVar4 = std::__cxx11::string::compare
                            ((char *)((this->_channels).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar10)),
         iVar4 != 0)) {
        fVar15 = ABS(*(float *)(_imath_half_to_float_table +
                               (ulong)*(ushort *)
                                       (*(long *)&(this->_results).
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar10 * 2) * 4
                               ) -
                     *(float *)(_imath_half_to_float_table +
                               (ulong)(data->
                                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar13]._h * 4));
        if (0.005 < fVar15) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sample ",7);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," (channel ",10);
          pbVar12 = (this->_channels).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,pbVar12[lVar10]._M_dataplus._M_p,
                              pbVar12[lVar10]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"doesn\'t match expected value (channel ",0x26);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," of pixel ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,") : ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"got ",4);
          poVar6 = (ostream *)
                   ::operator<<((ostream *)&std::cout,
                                (half)(data->
                                      super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                      )._M_impl.super__Vector_impl_data._M_start[lVar13]._h);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," expected ",10);
          plVar7 = (long *)::operator<<(poVar6,(half)*(uint16_t *)
                                                      (*(long *)&(this->_results).
                                                                                                                                  
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar10 * 2));
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          fVar15 = ABS(*(float *)(_imath_half_to_float_table +
                                 (ulong)*(ushort *)
                                         (*(long *)&(this->_results).
                                                                                                        
                                                  super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                                  super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                                  ._M_impl.super__Vector_impl_data + lVar10 * 2) * 4
                                 ) -
                       *(float *)(_imath_half_to_float_table +
                                 (ulong)(data->
                                        super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>
                                        )._M_impl.super__Vector_impl_data._M_start[lVar13]._h * 4));
        }
        if (0.005 < fVar15) {
          __assert_fail("fabs (_results[pel][channel] - data[i]) <= 0.005",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCompositeDeepScanLine.cpp"
                        ,0x166,
                        "void (anonymous namespace)::data<Imath_3_2::half>::checkValues(const vector<T> &, const Box2i &, bool) [T = Imath_3_2::half]"
                       );
        }
      }
      lVar10 = lVar10 + 1;
      pbVar12 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar10 == (long)(this->_channels).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) {
        lVar11 = lVar11 + 1;
        if (lVar11 == ((long)(this->_results).
                             super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_results).
                             super__Vector_base<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>,_std::allocator<std::vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
        {
          lVar11 = 0;
        }
        lVar10 = 0;
      }
      lVar13 = lVar13 + 1;
    } while (lVar5 != lVar13);
  }
  return;
}

Assistant:

void checkValues (
        const vector<T>& data, const Box2i& dw, bool dontbothercheckingdepth)
    {
        size_t size =
            _channels.size () + (dw.size ().x + 1) * (dw.size ().y + 1);
        size_t pel     = 0;
        size_t channel = 0;
        if (dontbothercheckingdepth)
        {
            for (size_t i = 0; i < size; i++)
            {
                if (_channels[channel] != "Z" && _channels[channel] != "ZBack")
                {
                    if (fabs (_results[pel][channel] - data[i]) > 0.005)
                    {
                        cout << "sample " << i << " (channel "
                             << _channels[channel] << " of pixel "
                             << i % _channels.size () << ") ";
                        cout << "doesn't match expected value (channel "
                             << channel << " of pixel " << pel << ") : ";
                        cout << "got " << data[i] << " expected "
                             << _results[pel][channel] << endl;
                    }
                    assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                }
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
        else
        {
            for (size_t i = 0; i < size; i++)
            {
                if (fabs (_results[pel][channel] - data[i]) > 0.005)
                {
                    cout << "sample " << i << " (channel " << _channels[channel]
                         << " of pixel " << i % _channels.size () << ") ";
                    cout << "doesn't match expected value (channel " << channel
                         << " of pixel " << pel << ") : ";
                    cout << "got " << data[i] << " expected "
                         << _results[pel][channel] << endl;
                }
                assert (fabs (_results[pel][channel] - data[i]) <= 0.005);
                channel++;
                if (channel == _channels.size ())
                {
                    channel = 0;
                    pel++;
                    if (pel == _results.size ()) { pel = 0; }
                }
            }
        }
    }